

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# library.cpp
# Opt level: O3

void example_class_import_wrap(ExampleClass *self,object *py_buffer)

{
  long lVar1;
  stl_input_iterator<char> end;
  stl_input_iterator<char> begin;
  vector<char,_std::allocator<char>_> buffer;
  allocator_type local_61;
  stl_input_iterator<char> local_60;
  stl_input_iterator_impl local_50;
  stl_input_iterator_impl local_40;
  stl_input_iterator<char> local_30;
  uchar *local_20;
  int local_18;
  
  boost::python::objects::stl_input_iterator_impl::stl_input_iterator_impl(&local_40,py_buffer);
  boost::python::objects::stl_input_iterator_impl::stl_input_iterator_impl(&local_50);
  *(long *)local_40.it_.super_object_base.m_ptr = *(long *)local_40.it_.super_object_base.m_ptr + 1;
  local_60.impl_.it_.super_object_base.m_ptr = local_40.it_.super_object_base.m_ptr;
  if (local_40.ob_.m_p != (_object *)0x0) {
    (local_40.ob_.m_p)->ob_refcnt = (local_40.ob_.m_p)->ob_refcnt + 1;
  }
  local_60.impl_.ob_.m_p = local_40.ob_.m_p;
  *(long *)local_50.it_.super_object_base.m_ptr = *(long *)local_50.it_.super_object_base.m_ptr + 1;
  local_30.impl_.it_.super_object_base.m_ptr = local_50.it_.super_object_base.m_ptr;
  if (local_50.ob_.m_p != (_object *)0x0) {
    (local_50.ob_.m_p)->ob_refcnt = (local_50.ob_.m_p)->ob_refcnt + 1;
  }
  local_30.impl_.ob_.m_p = local_50.ob_.m_p;
  std::vector<char,std::allocator<char>>::vector<boost::python::stl_input_iterator<char>,void>
            ((vector<char,std::allocator<char>> *)&local_20,&local_60,&local_30,&local_61);
  if (local_30.impl_.ob_.m_p != (_object *)0x0) {
    if ((local_30.impl_.ob_.m_p)->ob_refcnt < 1) goto LAB_00109a2d;
    lVar1 = (local_30.impl_.ob_.m_p)->ob_refcnt + -1;
    (local_30.impl_.ob_.m_p)->ob_refcnt = lVar1;
    if (lVar1 == 0) {
      _Py_Dealloc();
    }
  }
  if (0 < *(Py_ssize_t *)local_30.impl_.it_.super_object_base.m_ptr) {
    lVar1 = *(Py_ssize_t *)local_30.impl_.it_.super_object_base.m_ptr + -1;
    *(Py_ssize_t *)local_30.impl_.it_.super_object_base.m_ptr = lVar1;
    if (lVar1 == 0) {
      _Py_Dealloc();
    }
    if (local_60.impl_.ob_.m_p != (_object *)0x0) {
      if ((local_60.impl_.ob_.m_p)->ob_refcnt < 1) goto LAB_00109a2d;
      lVar1 = (local_60.impl_.ob_.m_p)->ob_refcnt + -1;
      (local_60.impl_.ob_.m_p)->ob_refcnt = lVar1;
      if (lVar1 == 0) {
        _Py_Dealloc();
      }
    }
    if (*(Py_ssize_t *)local_60.impl_.it_.super_object_base.m_ptr < 1) goto LAB_00109a0e;
    lVar1 = *(Py_ssize_t *)local_60.impl_.it_.super_object_base.m_ptr + -1;
    *(Py_ssize_t *)local_60.impl_.it_.super_object_base.m_ptr = lVar1;
    if (lVar1 == 0) {
      _Py_Dealloc();
    }
    ExampleClass::import(self,local_20,local_18 - (int)local_20);
    if (local_20 != (uchar *)0x0) {
      operator_delete(local_20);
    }
    if (local_50.ob_.m_p != (_object *)0x0) {
      if ((local_50.ob_.m_p)->ob_refcnt < 1) goto LAB_00109a2d;
      lVar1 = (local_50.ob_.m_p)->ob_refcnt + -1;
      (local_50.ob_.m_p)->ob_refcnt = lVar1;
      if (lVar1 == 0) {
        _Py_Dealloc();
      }
    }
    if (0 < *(Py_ssize_t *)local_50.it_.super_object_base.m_ptr) {
      lVar1 = *(Py_ssize_t *)local_50.it_.super_object_base.m_ptr + -1;
      *(Py_ssize_t *)local_50.it_.super_object_base.m_ptr = lVar1;
      if (lVar1 == 0) {
        _Py_Dealloc();
      }
      if (local_40.ob_.m_p != (_object *)0x0) {
        if ((local_40.ob_.m_p)->ob_refcnt < 1) {
LAB_00109a2d:
          __assert_fail("!p || Py_REFCNT(python::upcast<PyObject>(p)) > 0",
                        "/usr/include/boost/python/refcount.hpp",0x25,
                        "void boost::python::xdecref(T *) [T = _object]");
        }
        lVar1 = (local_40.ob_.m_p)->ob_refcnt + -1;
        (local_40.ob_.m_p)->ob_refcnt = lVar1;
        if (lVar1 == 0) {
          _Py_Dealloc();
        }
      }
      if (0 < *(Py_ssize_t *)local_40.it_.super_object_base.m_ptr) {
        lVar1 = *(Py_ssize_t *)local_40.it_.super_object_base.m_ptr + -1;
        *(Py_ssize_t *)local_40.it_.super_object_base.m_ptr = lVar1;
        if (lVar1 == 0) {
          _Py_Dealloc();
        }
        return;
      }
    }
  }
LAB_00109a0e:
  __assert_fail("Py_REFCNT(m_ptr) > 0","/usr/include/boost/python/object_core.hpp",0x1a6,
                "boost::python::api::object_base::~object_base()");
}

Assistant:

void example_class_import_wrap(ExampleClass& self, boost::python::object py_buffer)
{
  namespace python = boost::python;
  python::stl_input_iterator<char> begin(py_buffer), end;
  
  // Copy the py_buffer into a local buffer with known continguous memory.
  std::vector<char> buffer(begin, end);

  // Cast and delegate to the printBuffer member function.
  self.import(reinterpret_cast<unsigned char*>(&buffer[0]), buffer.size());
}